

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O2

void __thiscall cursespp::ScrollableWindow::ScrollUp(ScrollableWindow *this,int delta)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar2;
  
  iVar1 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x43])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (*plVar2 != 0) {
    iVar1 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x42])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
              ((long *)CONCAT44(extraout_var_00,iVar1),this,*plVar2 - (long)delta,plVar2);
    (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[4])(this);
    return;
  }
  return;
}

Assistant:

void ScrollableWindow::ScrollUp(int delta) {
    ScrollPos &pos = this->GetMutableScrollPosition();

    if (pos.firstVisibleEntryIndex > 0) {
        GetScrollAdapter().DrawPage(
            this, pos.firstVisibleEntryIndex - delta, pos);

        this->Invalidate();
    }
}